

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  int32 iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  string *psVar6;
  FieldOptions *pFVar7;
  FieldOptions *pFVar8;
  FieldDescriptor *pFVar9;
  string local_48;
  
  proto->_has_bits_[0] = proto->_has_bits_[0] | 1;
  if (proto->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar6 = (string *)operator_new(0x20);
    (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
    psVar6->_M_string_length = 0;
    (psVar6->field_2)._M_local_buf[0] = '\0';
    proto->name_ = psVar6;
  }
  std::__cxx11::string::_M_assign((string *)proto->name_);
  iVar1 = *(int32 *)(this + 0x28);
  proto->_has_bits_[0] = proto->_has_bits_[0] | 2;
  proto->number_ = iVar1;
  iVar2 = *(int *)(this + 0x30);
  bVar5 = FieldDescriptorProto_Label_IsValid(iVar2);
  if (!bVar5) {
    __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                  ,0xe16,
                  "void google::protobuf::FieldDescriptorProto::set_label(::google::protobuf::FieldDescriptorProto_Label)"
                 );
  }
  *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 4;
  proto->label_ = iVar2;
  iVar2 = *(int *)(this + 0x2c);
  bVar5 = FieldDescriptorProto_Type_IsValid(iVar2);
  if (!bVar5) {
    __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/descriptor.pb.h"
                  ,0xe2d,
                  "void google::protobuf::FieldDescriptorProto::set_type(::google::protobuf::FieldDescriptorProto_Type)"
                 );
  }
  uVar3 = proto->_has_bits_[0];
  proto->_has_bits_[0] = uVar3 | 8;
  proto->type_ = iVar2;
  if (this[0x34] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x38) + 0x29) == '\0') {
      proto->_has_bits_[0] = uVar3 | 0x28;
      if (proto->extendee_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        proto->extendee_ = psVar6;
      }
      std::__cxx11::string::_M_replace
                ((ulong)proto->extendee_,0,(char *)proto->extendee_->_M_string_length,0x250012);
    }
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 0x20;
    if (proto->extendee_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar6 = (string *)operator_new(0x20);
      (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
      psVar6->_M_string_length = 0;
      (psVar6->field_2)._M_local_buf[0] = '\0';
      proto->extendee_ = psVar6;
    }
    std::__cxx11::string::_M_append
              ((char *)proto->extendee_,**(ulong **)(*(long *)(this + 0x38) + 8));
  }
  if (*(int *)(kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4) == 8) {
    if (*(char *)(*(long *)(this + 0x50) + 0x29) == '\0') {
      *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 0x10;
      if (proto->type_name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        proto->type_name_ = psVar6;
      }
      std::__cxx11::string::_M_replace
                ((ulong)proto->type_name_,0,(char *)proto->type_name_->_M_string_length,0x250012);
    }
    pFVar9 = this + 0x50;
  }
  else {
    if (*(int *)(kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x2c) * 4) != 10) goto LAB_001ceded;
    lVar4 = *(long *)(this + 0x48);
    if (*(char *)(lVar4 + 0x28) == '\x01') {
      proto->type_ = 1;
      *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] & 0xf7;
    }
    if (*(char *)(lVar4 + 0x29) == '\0') {
      *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 0x10;
      if (proto->type_name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar6 = (string *)operator_new(0x20);
        (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
        psVar6->_M_string_length = 0;
        (psVar6->field_2)._M_local_buf[0] = '\0';
        proto->type_name_ = psVar6;
      }
      std::__cxx11::string::_M_replace
                ((ulong)proto->type_name_,0,(char *)proto->type_name_->_M_string_length,0x250012);
    }
    pFVar9 = this + 0x48;
  }
  *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 0x10;
  if (proto->type_name_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar6 = (string *)operator_new(0x20);
    (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
    psVar6->_M_string_length = 0;
    (psVar6->field_2)._M_local_buf[0] = '\0';
    proto->type_name_ = psVar6;
  }
  std::__cxx11::string::_M_append((char *)proto->type_name_,**(ulong **)(*(long *)pFVar9 + 8));
LAB_001ceded:
  if (this[0x68] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_(&local_48,this,false);
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 0x40;
    if (proto->default_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar6 = (string *)operator_new(0x20);
      (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
      psVar6->_M_string_length = 0;
      (psVar6->field_2)._M_local_buf[0] = '\0';
      proto->default_value_ = psVar6;
    }
    std::__cxx11::string::_M_assign((string *)proto->default_value_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  pFVar8 = *(FieldOptions **)(this + 0x60);
  pFVar7 = FieldOptions::default_instance();
  if (pFVar8 != pFVar7) {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 0x80;
    if (proto->options_ == (FieldOptions *)0x0) {
      pFVar8 = (FieldOptions *)operator_new(0x70);
      FieldOptions::FieldOptions(pFVar8);
      proto->options_ = pFVar8;
    }
    FieldOptions::CopyFrom(proto->options_,*(FieldOptions **)(this + 0x60));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
                     implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
                    implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}